

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O1

void __thiscall
JointActionObservationHistory::GetJointActionObservationHistoryVectors
          (JointActionObservationHistory *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs)

{
  iterator iVar1;
  uint *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jaIsReversed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> joIsReversed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  GetJointActionObservationHistoryVectorsRecursive(this,&local_58,&local_38);
  puVar2 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      puVar2 = puVar2 + -1;
      iVar1._M_current =
           (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)jaIs,iVar1,puVar2);
      }
      else {
        *iVar1._M_current = *puVar2;
        (jaIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    } while (puVar2 != local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      puVar2 = puVar2 + -1;
      iVar1._M_current =
           (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)joIs,iVar1,puVar2);
      }
      else {
        *iVar1._M_current = *puVar2;
        (joIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    } while (puVar2 != local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void 
JointActionObservationHistory::GetJointActionObservationHistoryVectors(
//    JointActionObservationHistory *joah,
    vector<Index> &jaIs, vector<Index> &joIs)
{
    vector<Index> jaIsReversed;
    vector<Index> joIsReversed;

    GetJointActionObservationHistoryVectorsRecursive( jaIsReversed,
            joIsReversed);

    // reverse both vectors
    for(vector<Index>::reverse_iterator it=jaIsReversed.rbegin();
        it!=jaIsReversed.rend(); ++it)
        jaIs.push_back(*it);

    for(vector<Index>::reverse_iterator it=joIsReversed.rbegin();
        it!=joIsReversed.rend(); ++it)
        joIs.push_back(*it);

#if DEBUG_JAOH
    cout << SoftPrint() << " " << SoftPrintVector(jaIsReversed) << " "
         << SoftPrintVector(joIsReversed) << endl;
#endif
}